

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugCompareHighsInfoStatus(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  HighsDebugStatus HVar2;
  HighsDebugStatus return_status;
  HighsDebugStatus in_stack_ffffffffffffff60;
  HighsDebugStatus in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  allocator *paVar3;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  string *name;
  allocator local_79;
  string local_78 [55];
  undefined1 local_41 [37];
  HighsDebugStatus local_1c;
  
  local_1c = 0;
  name = (string *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"primal_status",(allocator *)name);
  HVar1 = debugCompareHighsInfoInteger
                    (name,(HighsOptions *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffff68);
  HVar2 = debugWorseStatus(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  local_1c = HVar2;
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  paVar3 = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"dual_status",paVar3);
  HVar1 = debugCompareHighsInfoInteger
                    (name,(HighsOptions *)CONCAT44(HVar1,HVar2),(HighsInt)((ulong)paVar3 >> 0x20),
                     (HighsInt)paVar3);
  local_1c = debugWorseStatus(HVar1,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return local_1c;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoStatus(const HighsOptions& options,
                                             const HighsInfo& highs_info0,
                                             const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("primal_status", options,
                                   highs_info0.primal_solution_status,
                                   highs_info1.primal_solution_status),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("dual_status", options,
                                   highs_info0.dual_solution_status,
                                   highs_info1.dual_solution_status),
      return_status);
  return return_status;
}